

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::CopyPropagateArrays::IsInterpolationInstruction
          (CopyPropagateArrays *this,Instruction *inst)

{
  uint32_t uVar1;
  FeatureManager *pFVar2;
  
  if (inst->opcode_ == OpExtInst) {
    uVar1 = Instruction::GetSingleWordInOperand(inst,0);
    pFVar2 = IRContext::get_feature_mgr((this->super_MemPass).super_Pass.context_);
    if ((uVar1 == pFVar2->extinst_importid_GLSLstd450_) &&
       (uVar1 = Instruction::GetSingleWordInOperand(inst,1), uVar1 - 0x4c < 3)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool CopyPropagateArrays::IsInterpolationInstruction(Instruction* inst) {
  if (inst->opcode() == spv::Op::OpExtInst &&
      inst->GetSingleWordInOperand(kExtInstSetInIdx) ==
          context()->get_feature_mgr()->GetExtInstImportId_GLSLstd450()) {
    uint32_t ext_inst = inst->GetSingleWordInOperand(kExtInstOpInIdx);
    switch (ext_inst) {
      case GLSLstd450InterpolateAtCentroid:
      case GLSLstd450InterpolateAtOffset:
      case GLSLstd450InterpolateAtSample:
        return true;
    }
  }
  return false;
}